

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int pool_bulk_lookup(StringPool *pool,xmlHashTablePtr hash,size_t num,int existing)

{
  size_t sVar1;
  xmlChar **names;
  xmlChar *local_58;
  xmlChar *res;
  int q;
  xmlChar **str;
  ulong uStack_38;
  int ret;
  size_t j;
  size_t i;
  int existing_local;
  size_t num_local;
  xmlHashTablePtr hash_local;
  StringPool *pool_local;
  
  str._4_4_ = 0;
  j = pool->index;
  uStack_38 = 0;
  for (; j < pool->num_strings && uStack_38 < num; j = pool->num_keys + j) {
    names = pool->strings + j;
    for (res._4_4_ = 0; res._4_4_ < 2; res._4_4_ = res._4_4_ + 1) {
      local_58 = (xmlChar *)0x0;
      if (res._4_4_ == 0) {
        sVar1 = pool->num_keys;
        if (sVar1 == 1) {
          local_58 = (xmlChar *)xmlHashLookup(hash,*names);
        }
        else if (sVar1 == 2) {
          local_58 = (xmlChar *)xmlHashLookup2(hash,*names,names[1]);
        }
        else if (sVar1 == 3) {
          local_58 = (xmlChar *)xmlHashLookup3(hash,*names,names[1],names[2]);
        }
      }
      else {
        local_58 = hash_qlookup(hash,names,pool->num_keys);
      }
      if (existing == 0) {
        if (local_58 != (xmlChar *)0x0) {
          str._4_4_ = -1;
        }
      }
      else if (local_58 != *names) {
        str._4_4_ = -1;
      }
    }
    uStack_38 = uStack_38 + 1;
  }
  pool->index = j;
  return str._4_4_;
}

Assistant:

static int
pool_bulk_lookup(StringPool *pool, xmlHashTablePtr hash, size_t num,
                 int existing) {
    size_t i, j;
    int ret = 0;

    for (i = pool->index, j = 0; i < pool->num_strings && j < num; j++) {
        xmlChar **str = &pool->strings[i];
        int q;

        for (q = 0; q < 2; q++) {
            xmlChar *res = NULL;

            if (q) {
                res = hash_qlookup(hash, str, pool->num_keys);
            } else {
                switch (pool->num_keys) {
                    case 1:
                        res = xmlHashLookup(hash, str[0]);
                        break;
                    case 2:
                        res = xmlHashLookup2(hash, str[0], str[1]);
                        break;
                    case 3:
                        res = xmlHashLookup3(hash, str[0], str[1], str[2]);
                        break;
                }
            }

            if (existing) {
                if (res != str[0])
                    ret = -1;
            } else {
                if (res != NULL)
                    ret = -1;
            }
        }

        i += pool->num_keys;
    }

    pool->index = i;
    return ret;
}